

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void write_density(bool write_x,bool write_y,bool write_z,string *x_folder,string *y_folder,
                  string *z_folder,bool write_ions,bool scale_j)

{
  undefined8 uVar1;
  long *plVar2;
  ofstream *poVar3;
  ofstream *poVar4;
  ofstream *poVar5;
  long *plVar6;
  ulong uVar7;
  _Ios_Openmode _Var8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string file_name_z;
  string file_name_y;
  string file_name_suffix;
  string file_name_x;
  char s_cmr [20];
  ofstream fout_irho;
  char *local_2e8 [2];
  char local_2d8 [16];
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  string local_288;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  char local_248 [24];
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  ios_base local_138 [264];
  
  OutputIterations::get_current_iteration_string_abi_cxx11_(&local_288,&output_iterations);
  local_2a8 = &local_298;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a8,data_folder_abi_cxx11_._M_dataplus._M_p,
             data_folder_abi_cxx11_._M_dataplus._M_p + data_folder_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_2a8);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2a8,(ulong)(x_folder->_M_dataplus)._M_p);
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_220 = *plVar6;
    lStack_218 = plVar2[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar6;
    local_230 = (long *)*plVar2;
  }
  local_228 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_230,(ulong)local_288._M_dataplus._M_p);
  local_268 = &local_258;
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_258 = *plVar6;
    lStack_250 = plVar2[3];
  }
  else {
    local_258 = *plVar6;
    local_268 = (long *)*plVar2;
  }
  local_260 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  local_2c8 = &local_2b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,data_folder_abi_cxx11_._M_dataplus._M_p,
             data_folder_abi_cxx11_._M_dataplus._M_p + data_folder_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_2c8);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2c8,(ulong)(y_folder->_M_dataplus)._M_p);
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_220 = *plVar6;
    lStack_218 = plVar2[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar6;
    local_230 = (long *)*plVar2;
  }
  local_228 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_230,(ulong)local_288._M_dataplus._M_p);
  local_2a8 = &local_298;
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_298 = *plVar6;
    lStack_290 = plVar2[3];
  }
  else {
    local_298 = *plVar6;
    local_2a8 = (long *)*plVar2;
  }
  local_2a0 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2e8,data_folder_abi_cxx11_._M_dataplus._M_p,
             data_folder_abi_cxx11_._M_dataplus._M_p + data_folder_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_2e8);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_2e8,(ulong)(z_folder->_M_dataplus)._M_p);
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_220 = *plVar6;
    lStack_218 = plVar2[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar6;
    local_230 = (long *)*plVar2;
  }
  local_228 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_230,(ulong)local_288._M_dataplus._M_p);
  local_2c8 = &local_2b8;
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_2b8 = *plVar6;
    lStack_2b0 = plVar2[3];
  }
  else {
    local_2b8 = *plVar6;
    local_2c8 = (long *)*plVar2;
  }
  local_2c0 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0]);
  }
  uVar13 = (ulong)(uint)n_sr;
  if (0 < n_sr) {
    uVar7 = 0;
    poVar3 = (ofstream *)0x0;
    poVar4 = (ofstream *)0x0;
    poVar5 = (ofstream *)0x0;
    do {
      if (uVar7 == (uint)mpi_rank) {
        if (write_x) {
          poVar3 = (ofstream *)operator_new(0x200);
          std::ofstream::ofstream(poVar3,(char *)local_268,output_mode);
        }
        if (write_y) {
          poVar4 = (ofstream *)operator_new(0x200);
          std::ofstream::ofstream(poVar4,(char *)local_2a8,output_mode);
        }
        if (write_z) {
          poVar5 = (ofstream *)operator_new(0x200);
          std::ofstream::ofstream(poVar5,(char *)local_2c8,output_mode);
        }
        iVar11 = nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar7];
        if (uVar7 != n_sr - 1) {
          iVar11 = iVar11 - nx_ich / 2;
        }
        if (uVar7 == 0) {
          iVar9 = 0;
        }
        else {
          iVar9 = nx_ich / 2;
        }
        if (scale_j) {
          spatial_region::scale_j
                    ((spatial_region *)
                     psr._M_t.
                     super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                     super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,dx / dt);
        }
        spatial_region::fout_rho
                  ((spatial_region *)
                   psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,poVar3,poVar4,poVar5,
                   iVar9,iVar11,output_mode);
        if (poVar3 != (ofstream *)0x0) {
          (**(code **)(*(long *)poVar3 + 8))(poVar3);
        }
        if (poVar4 != (ofstream *)0x0) {
          (**(code **)(*(long *)poVar4 + 8))(poVar4);
        }
        if (poVar5 == (ofstream *)0x0) {
          poVar5 = (ofstream *)0x0;
        }
        else {
          (**(code **)(*(long *)poVar5 + 8))(poVar5);
        }
      }
      MPI_Barrier(&ompi_mpi_comm_world);
      uVar7 = uVar7 + 1;
      uVar13 = (ulong)n_sr;
    } while ((long)uVar7 < (long)uVar13);
  }
  uVar7 = uVar13 & 0xffffffff;
  do {
    uVar7 = uVar7 - 1;
    if ((int)uVar13 < 2) {
      uVar12 = 0;
      break;
    }
    uVar12 = (int)uVar13 - 1;
    uVar13 = (ulong)uVar12;
  } while ((int)((xlength - x0fout) / dx) <
           x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar7 & 0xffffffff]);
  if (mpi_rank == uVar12) {
    _Var8 = output_mode | _S_app;
    if (write_x) {
      poVar3 = (ofstream *)operator_new(0x200);
      std::ofstream::ofstream(poVar3,(char *)local_268,_Var8);
    }
    else {
      poVar3 = (ofstream *)0x0;
    }
    if (write_y) {
      poVar4 = (ofstream *)operator_new(0x200);
      std::ofstream::ofstream(poVar4,(char *)local_2a8,_Var8);
    }
    else {
      poVar4 = (ofstream *)0x0;
    }
    if (write_z) {
      poVar5 = (ofstream *)operator_new(0x200);
      std::ofstream::ofstream(poVar5,(char *)local_2c8,_Var8);
    }
    else {
      poVar5 = (ofstream *)0x0;
    }
    spatial_region::fout_rho_yzplane
              ((spatial_region *)
               psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
               _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,poVar3,poVar4,poVar5,
               (int)((xlength - x0fout) / dx) -
               x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[(int)uVar12],_Var8);
    if (poVar3 != (ofstream *)0x0) {
      (**(code **)(*(long *)poVar3 + 8))(poVar3);
    }
    if (poVar4 != (ofstream *)0x0) {
      (**(code **)(*(long *)poVar4 + 8))(poVar4);
    }
    if (poVar5 != (ofstream *)0x0) {
      (**(code **)(*(long *)poVar5 + 8))(poVar5);
    }
  }
  if ((write_ions) &&
     (((iVar11 = std::__cxx11::string::compare((char *)&ions_abi_cxx11_), iVar11 == 0 ||
       (iVar11 = std::__cxx11::string::compare((char *)&ions_abi_cxx11_), iVar11 == 0)) &&
      (uVar1 = ___throw_bad_array_new_length, plVar2 = _VTT, 0 < n_ion_populations)))) {
    lVar10 = 0;
    do {
      sprintf(local_248,"%g",icmr[lVar10]);
      local_2e8[0] = local_2d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2e8,data_folder_abi_cxx11_._M_dataplus._M_p,
                 data_folder_abi_cxx11_._M_dataplus._M_p + data_folder_abi_cxx11_._M_string_length);
      std::__cxx11::string::append((char *)local_2e8);
      std::__cxx11::string::append((char *)local_2e8);
      std::__cxx11::string::append((char *)local_2e8);
      std::__cxx11::string::_M_append((char *)local_2e8,(ulong)local_288._M_dataplus._M_p);
      uVar13 = (ulong)(uint)n_sr;
      if (0 < n_sr) {
        uVar7 = 0;
        do {
          if (uVar7 == (uint)mpi_rank) {
            std::ofstream::ofstream((ofstream *)&local_230,local_2e8[0],output_mode);
            iVar11 = nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7];
            if (uVar7 != n_sr - 1) {
              iVar11 = iVar11 - nx_ich / 2;
            }
            if (uVar7 == 0) {
              iVar9 = 0;
            }
            else {
              iVar9 = nx_ich / 2;
            }
            spatial_region::fout_irho
                      ((spatial_region *)
                       psr._M_t.
                       super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                       .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,(int)lVar10,
                       (ofstream *)&local_230,iVar9,iVar11,output_mode);
            std::ofstream::close();
            local_230 = plVar2;
            *(undefined8 *)((long)&local_230 + plVar2[-3]) = uVar1;
            std::filebuf::~filebuf((filebuf *)&local_228);
            std::ios_base::~ios_base(local_138);
          }
          MPI_Barrier(&ompi_mpi_comm_world);
          uVar7 = uVar7 + 1;
          uVar13 = (ulong)n_sr;
        } while ((long)uVar7 < (long)uVar13);
      }
      uVar7 = uVar13 & 0xffffffff;
      do {
        uVar7 = uVar7 - 1;
        if ((int)uVar13 < 2) {
          uVar12 = 0;
          break;
        }
        uVar12 = (int)uVar13 - 1;
        uVar13 = (ulong)uVar12;
      } while ((int)((xlength - x0fout) / dx) <
               x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar7 & 0xffffffff]);
      if (mpi_rank == uVar12) {
        _Var8 = output_mode | _S_app;
        std::ofstream::ofstream(&local_230,local_2e8[0],_Var8);
        spatial_region::fout_irho_yzplane
                  ((spatial_region *)
                   psr._M_t.
                   super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                   super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                   super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,(int)lVar10,
                   (ofstream *)&local_230,
                   (int)((xlength - x0fout) / dx) -
                   x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar12],_Var8);
        std::ofstream::close();
        local_230 = plVar2;
        *(undefined8 *)((long)&local_230 + plVar2[-3]) = uVar1;
        std::filebuf::~filebuf((filebuf *)&local_228);
        std::ios_base::~ios_base(local_138);
      }
      if (local_2e8[0] != local_2d8) {
        operator_delete(local_2e8[0]);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < n_ion_populations);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  return;
}

Assistant:

void write_density(bool write_x, bool write_y, bool write_z,
        std::string x_folder, std::string y_folder, std::string z_folder,
        bool write_ions = false, bool scale_j = false)
{
    std::string file_name_suffix = output_iterations.get_current_iteration_string();
    ofstream* pof_x = 0;
    ofstream* pof_y = 0;
    ofstream* pof_z = 0;

    string file_name_x = data_folder + "/" + x_folder + file_name_suffix;
    string file_name_y = data_folder + "/" + y_folder + file_name_suffix;
    string file_name_z = data_folder + "/" + z_folder + file_name_suffix;

    int onx;
    int onx0;
    for(int i=0;i<n_sr;i++)
    {
        if (mpi_rank == i) {
            if (write_x) {
                pof_x = new ofstream(file_name_x.c_str(), output_mode);
            }

            if (write_y) {
                pof_y = new ofstream(file_name_y.c_str(), output_mode);
            }
            if (write_z) {
                pof_z = new ofstream(file_name_z.c_str(), output_mode);
            }

            if(i==n_sr-1)
                onx = nx_sr[i];
            else
                onx = nx_sr[i]-nx_ich/2;
            if(i==0)
                onx0 = 0;
            else
                onx0 = nx_ich/2;
            if (scale_j) {
                psr->scale_j(dx / dt);
            }
            psr->fout_rho(pof_x,pof_y,pof_z,onx0,onx, output_mode);

            if (pof_x) delete pof_x;
            if (pof_y) delete pof_y;
            if (pof_z) delete pof_z;
        }
        MPI_Barrier(MPI_COMM_WORLD);
    }

    pof_x = 0;
    pof_y = 0;
    pof_z = 0;
    
    int ii = get_sr_for_x(xlength-x0fout);
    if (mpi_rank == ii) {
        ios_base::openmode mode = output_mode | ios_base::app;
        if (write_x) {
            pof_x = new ofstream(file_name_x.c_str(), mode);
        }
        if (write_y) {
            pof_y = new ofstream(file_name_y.c_str(), mode);
        }
        if (write_z) {
            pof_z = new ofstream(file_name_z.c_str(), mode);
        }
        psr->fout_rho_yzplane(pof_x,pof_y,pof_z,get_xindex_in_sr(xlength-x0fout, ii), mode);
        if (pof_x) delete pof_x;
        if (pof_y) delete pof_y;
        if (pof_z) delete pof_z;
    }

    if (write_ions && (ions=="on" || ions=="positrons"))
    {
        char s_cmr[20];
        for (int n=0;n<n_ion_populations;n++)
        {
            sprintf(s_cmr,"%g",icmr[n]);
            string file_name = data_folder+"/irho_";
            file_name += s_cmr;
            file_name += "_";
            file_name += file_name_suffix;
            for(int i=0;i<n_sr;i++)
            {
                if (mpi_rank == i) {
                    ofstream fout_irho(file_name.c_str(), output_mode);
                    if(i==n_sr-1)
                        onx = nx_sr[i];
                    else
                        onx = nx_sr[i]-nx_ich/2;
                    if(i==0)
                        onx0 = 0;
                    else
                        onx0 = nx_ich/2;
                    psr->fout_irho(n,&fout_irho,onx0,onx, output_mode);
                    fout_irho.close();
                }
                MPI_Barrier(MPI_COMM_WORLD);
            }
            ii = get_sr_for_x(xlength-x0fout);
            if (mpi_rank == ii) {
                ios_base::openmode mode = output_mode | ios_base::app;
                ofstream fout_irho(file_name.c_str(), mode);
                psr->fout_irho_yzplane(n,&fout_irho,get_xindex_in_sr(xlength-x0fout, ii), mode);
                fout_irho.close();
            }
        }
    }
}